

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int make_table_recurse(archive_read *a,huffman_code *code,int node,huffman_table_entry *table,
                      int depth,int maxdepth)

{
  huffman_tree_node *phVar1;
  uint uVar2;
  ulong uVar3;
  char *fmt;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint local_44;
  
  iVar6 = maxdepth - depth;
  uVar7 = 0;
  local_44 = depth;
  do {
    phVar1 = code->tree;
    if (phVar1 == (huffman_tree_node *)0x0) {
      fmt = "Huffman tree was not created.";
LAB_005800bc:
      archive_set_error(&a->archive,0x54,fmt);
      uVar5 = 0xffffffe2;
LAB_0058011a:
      return uVar7 | uVar5;
    }
    if ((node < 0) || (code->numentries <= node)) {
      fmt = "Invalid location to Huffman tree specified.";
      goto LAB_005800bc;
    }
    uVar5 = 1 << ((byte)iVar6 & 0x1f);
    if (phVar1[(uint)node].branches[0] == phVar1[(uint)node].branches[1]) {
      if (local_44 - maxdepth != -0x1f) {
        uVar3 = 1;
        if (1 < (int)uVar5) {
          uVar3 = (ulong)uVar5;
        }
        uVar5 = 0;
        uVar4 = 0;
        do {
          table[uVar4].length = local_44;
          table[uVar4].value = phVar1[(uint)node].branches[0];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        goto LAB_0058011a;
      }
LAB_00580118:
      uVar5 = 0;
      goto LAB_0058011a;
    }
    if (local_44 == maxdepth) {
      table->length = maxdepth + 1;
      table->value = node;
      goto LAB_00580118;
    }
    local_44 = local_44 + 1;
    uVar2 = make_table_recurse(a,code,phVar1[(uint)node].branches[0],table,local_44,maxdepth);
    node = code->tree[(uint)node].branches[1];
    table = table + (int)uVar5 / 2;
    uVar7 = uVar7 | uVar2;
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

static int
make_table_recurse(struct archive_read *a, struct huffman_code *code, int node,
                   struct huffman_table_entry *table, int depth,
                   int maxdepth)
{
  int currtablesize, i, ret = (ARCHIVE_OK);

  if (!code->tree)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Huffman tree was not created.");
    return (ARCHIVE_FATAL);
  }
  if (node < 0 || node >= code->numentries)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid location to Huffman tree specified.");
    return (ARCHIVE_FATAL);
  }

  currtablesize = 1 << (maxdepth - depth);

  if (code->tree[node].branches[0] ==
    code->tree[node].branches[1])
  {
    for(i = 0; i < currtablesize; i++)
    {
      table[i].length = depth;
      table[i].value = code->tree[node].branches[0];
    }
  }
  else if (node < 0)
  {
    for(i = 0; i < currtablesize; i++)
      table[i].length = -1;
  }
  else
  {
    if(depth == maxdepth)
    {
      table[0].length = maxdepth + 1;
      table[0].value = node;
    }
    else
    {
      ret |= make_table_recurse(a, code, code->tree[node].branches[0], table,
                                depth + 1, maxdepth);
      ret |= make_table_recurse(a, code, code->tree[node].branches[1],
                         table + currtablesize / 2, depth + 1, maxdepth);
    }
  }
  return ret;
}